

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler.cc
# Opt level: O0

void __thiscall CpuProfiler::CpuProfiler(CpuProfiler *this)

{
  bool bVar1;
  __uid_t _Var2;
  __uid_t _Var3;
  char *pcVar4;
  long lVar5;
  __sighandler_t p_Var6;
  int *piVar7;
  char local_1038 [8];
  char fname [4096];
  intptr_t old_signal_handler;
  long signal_number;
  char *signal_number_str;
  CpuProfiler *this_local;
  
  SpinLock::SpinLock(&this->lock_);
  ProfileData::ProfileData(&this->collector_);
  this->prof_handler_token_ = (ProfileHandlerToken *)0x0;
  pcVar4 = getenv("CPUPROFILE");
  if (pcVar4 != (char *)0x0) {
    _Var2 = getuid();
    _Var3 = geteuid();
    if (_Var2 == _Var3) {
      pcVar4 = getenv("CPUPROFILESIGNAL");
      if (pcVar4 == (char *)0x0) {
        bVar1 = GetUniquePathFromEnv("CPUPROFILE",local_1038);
        if ((bVar1) && (bVar1 = Start(this,local_1038,(ProfilerOptions *)0x0), !bVar1)) {
          piVar7 = __errno_location();
          pcVar4 = strerror(*piVar7);
          RAW_LOG(-4,"Can\'t turn on cpu profiling for \'%s\': %s\n",local_1038,pcVar4);
        }
      }
      else {
        lVar5 = strtol(pcVar4,(char **)0x0,10);
        if ((lVar5 < 1) || (0x40 < lVar5)) {
          RAW_LOG(-4,"Signal number %s is invalid\n",pcVar4);
        }
        else {
          p_Var6 = signal((int)lVar5,CpuProfilerSwitch);
          if (p_Var6 == (__sighandler_t)0x0) {
            RAW_LOG(-1,"Using signal %d as cpu profiling switch",lVar5);
          }
          else {
            RAW_LOG(-4,"Signal %d already in use\n",lVar5);
          }
        }
      }
    }
  }
  return;
}

Assistant:

CpuProfiler::CpuProfiler()
    : prof_handler_token_(nullptr) {
  if (getenv("CPUPROFILE") == nullptr) {
    return;
  }

  // We don't enable profiling if setuid -- it's a security risk
#ifdef HAVE_GETEUID
  if (getuid() != geteuid()) {
    return;
  }
#endif

  char *signal_number_str = getenv("CPUPROFILESIGNAL");
  if (signal_number_str != nullptr) {
    long int signal_number = strtol(signal_number_str, nullptr, 10);
    if (signal_number >= 1 && signal_number <= 64) {
      intptr_t old_signal_handler = reinterpret_cast<intptr_t>(signal(signal_number, CpuProfilerSwitch));
      if (old_signal_handler == 0) {
        RAW_LOG(INFO,"Using signal %d as cpu profiling switch", signal_number);
      } else {
        RAW_LOG(FATAL, "Signal %d already in use\n", signal_number);
      }
    } else {
      RAW_LOG(FATAL, "Signal number %s is invalid\n", signal_number_str);
    }
  } else {
    char fname[PATH_MAX];
    if (!GetUniquePathFromEnv("CPUPROFILE", fname)) {
      return;
    }

    if (!Start(fname, nullptr)) {
      RAW_LOG(FATAL, "Can't turn on cpu profiling for '%s': %s\n",
              fname, strerror(errno));
    }
  }
}